

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

BOOL __thiscall GlobOpt::PRE::PreloadPRECandidate(PRE *this,Loop *loop,GlobHashBucket *candidate)

{
  GlobOptBlockData *this_00;
  SymIdToInstrMap *pSVar1;
  Type piVar2;
  code *pcVar3;
  Value *pVVar4;
  bool bVar5;
  BOOLEAN BVar6;
  uint uVar7;
  undefined4 *puVar8;
  Instr *pIVar9;
  RegOpnd *newDst;
  Value *pVVar10;
  PropertySym *pPVar11;
  StackSym *pSVar12;
  ProfiledInstr *pPVar13;
  Type pSVar14;
  JITTimeFunctionBody *pJVar15;
  FunctionJITTimeInfo *pFVar16;
  BasicBlock *pBVar17;
  char16_t *reason;
  uint uVar18;
  Loop *pLVar19;
  BasicBlock *pBVar20;
  BVSparse<Memory::JitArenaAllocator> *this_01;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar21;
  uint uVar22;
  PropertySym *local_90;
  PropertySym *propertySym;
  Value *initialValue;
  StackSym *local_78;
  StackSym *local_70;
  Value *local_68;
  Value *local_60;
  StackSym *local_58;
  Instr *local_50;
  Loop *local_48;
  PropertySym *local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType valueType;
  
  pPVar11 = (PropertySym *)candidate->value;
  local_48 = loop;
  if ((pPVar11->super_Sym).m_kind != SymKindProperty) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
    if (!bVar5) goto LAB_00440fe3;
    *puVar8 = 0;
  }
  local_90 = pPVar11;
  BVar6 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                    (this->candidates->candidatesToProcess,(pPVar11->super_Sym).m_id);
  pLVar19 = local_48;
  if (BVar6 != '\0') {
    local_60 = candidate->element;
    pSVar12 = pPVar11->m_stackSym;
    local_78 = (StackSym *)0x0;
    local_40 = pPVar11;
    bVar5 = GlobOptBlockData::IsLive(&local_48->landingPad->globOptData,&pSVar12->super_Sym);
    if (!bVar5) {
      pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->globOpt->func->m_workItem);
      uVar22 = JITTimeFunctionBody::GetSourceContextId(pJVar15);
      pFVar16 = JITTimeWorkItem::GetJITTimeInfo(this->globOpt->func->m_workItem);
      uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar16);
      bVar5 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_015a4e90,MakeObjSymLiveInLandingPadPhase,uVar22,uVar7);
      pLVar19 = local_48;
      if (bVar5) {
        return 0;
      }
      if (((pSVar12->field_0x18 & 1) == 0) || ((pSVar12->field_5).m_instrDef == (Instr *)0x0)) {
        reason = L"Object sym not live in landing pad and not single-def";
LAB_00440d70:
        TraceFailedPreloadInLandingPad(this,pLVar19,local_40,reason);
        return 0;
      }
      bVar5 = InsertSymDefinitionInLandingPad(this,pSVar12,local_48,(Sym **)&local_78);
      if (!bVar5) {
        reason = L"Failed to insert load of object sym in landing pad";
        goto LAB_00440d70;
      }
    }
    local_70 = pSVar12;
    bVar5 = GlobOptBlockData::IsLive(&pLVar19->landingPad->globOptData,&pSVar12->super_Sym);
    pVVar4 = local_60;
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3f5,"(loop->landingPad->globOptData.IsLive(objPtrSym))",
                         "loop->landingPad->globOptData.IsLive(objPtrSym)");
      if (!bVar5) goto LAB_00440fe3;
      *puVar8 = 0;
    }
    pBVar17 = pLVar19->landingPad;
    pSVar12 = (StackSym *)pVVar4->valueInfo->symStore;
    if ((pSVar12 == (StackSym *)0x0) ||
       (pBVar20 = pBVar17, (pSVar12->super_Sym).m_kind != SymKindStack)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3fc,"(symStore && symStore->IsStackSym())",
                         "symStore && symStore->IsStackSym()");
      if (!bVar5) goto LAB_00440fe3;
      *puVar8 = 0;
      pBVar20 = local_48->landingPad;
    }
    bVar5 = GlobOptBlockData::IsLive(&pBVar20->globOptData,(Sym *)pSVar12);
    if (bVar5) {
      return 0;
    }
    this_00 = &pBVar17->globOptData;
    local_68 = GlobOptBlockData::FindValue(this_00,&local_40->super_Sym);
    if (local_68 == (Value *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x408,"(landingPadValue)","landingPadValue");
      if (!bVar5) goto LAB_00440fe3;
      *puVar8 = 0;
    }
    pSVar1 = this->globOpt->prePassInstrMap;
    piVar2 = pSVar1->buckets;
    uVar22 = 0;
    initialValue = (Value *)this_00;
    local_58 = pSVar12;
    if (piVar2 != (Type)0x0) {
      uVar7 = JsUtil::
              BaseDictionary<unsigned_int,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::GetBucket((local_40->super_Sym).m_id * 2 + 1,pSVar1->bucketCount,
                          pSVar1->modFunctionIndex);
      uVar18 = piVar2[uVar7];
      if (-1 < (int)uVar18) {
        pSVar14 = pSVar1->entries;
        uVar22 = 0;
        do {
          if (pSVar14[uVar18].
              super_DefaultHashedEntry<unsigned_int,_IR::Instr_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
              .super_KeyValueEntry<unsigned_int,_IR::Instr_*>.
              super_ValueEntry<IR::Instr_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_IR::Instr_*>_>
              .super_KeyValueEntryDataLayout2<unsigned_int,_IR::Instr_*>.key ==
              (local_40->super_Sym).m_id) {
            if (pSVar1->stats != (DictionaryStats *)0x0) {
              DictionaryStats::Lookup(pSVar1->stats,uVar22);
              pSVar14 = pSVar1->entries;
            }
            pIVar9 = pSVar14[uVar18].
                     super_DefaultHashedEntry<unsigned_int,_IR::Instr_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                     .super_KeyValueEntry<unsigned_int,_IR::Instr_*>.
                     super_ValueEntry<IR::Instr_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_IR::Instr_*>_>
                     .super_KeyValueEntryDataLayout2<unsigned_int,_IR::Instr_*>.value;
            pLVar19 = local_48;
            if (pIVar9 == (Instr *)0x0) goto LAB_004409f9;
            goto LAB_00440a51;
          }
          uVar22 = uVar22 + 1;
          uVar18 = pSVar14[uVar18].
                   super_DefaultHashedEntry<unsigned_int,_IR::Instr_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .super_KeyValueEntry<unsigned_int,_IR::Instr_*>.
                   super_ValueEntry<IR::Instr_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_IR::Instr_*>_>
                   .super_KeyValueEntryDataLayout2<unsigned_int,_IR::Instr_*>.next;
        } while (-1 < (int)uVar18);
      }
    }
    pLVar19 = local_48;
    if (pSVar1->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Lookup(pSVar1->stats,uVar22);
    }
LAB_004409f9:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x40b,"(ldInstrInLoop)","ldInstrInLoop");
    if (!bVar5) {
LAB_00440fe3:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
    pIVar9 = (Instr *)0x0;
LAB_00440a51:
    if (pIVar9->m_dst != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x40c,"(ldInstrInLoop->GetDst() == nullptr)",
                         "ldInstrInLoop->GetDst() == nullptr");
      if (!bVar5) goto LAB_00440fe3;
      *puVar8 = 0;
    }
    bVar5 = IsPREInstrCandidateLoad(pIVar9->m_opcode);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x40f,"(IsPREInstrCandidateLoad(ldInstrInLoop->m_opcode))",
                         "IsPREInstrCandidateLoad(ldInstrInLoop->m_opcode)");
      if (!bVar5) goto LAB_00440fe3;
      *puVar8 = 0;
    }
    pIVar9 = InsertPropertySymPreloadInLandingPad(this,pIVar9,pLVar19,local_40);
    if (pIVar9 != (Instr *)0x0) {
      if (pIVar9->m_dst != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x417,"(ldInstr->GetDst() == nullptr)","ldInstr->GetDst() == nullptr");
        if (!bVar5) goto LAB_00440fe3;
        *puVar8 = 0;
      }
      if ((local_58->super_Sym).m_kind != SymKindStack) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar5) goto LAB_00440fe3;
        *puVar8 = 0;
      }
      pSVar12 = local_58;
      newDst = IR::RegOpnd::New(local_58,TyVar,this->globOpt->func);
      local_50 = pIVar9;
      IR::Instr::SetDst(pIVar9,&newDst->super_Opnd);
      BVSparse<Memory::JitArenaAllocator>::Set(pLVar19->fieldPRESymStores,(pSVar12->super_Sym).m_id)
      ;
      BVSparse<Memory::JitArenaAllocator>::Set
                ((pBVar17->globOptData).liveVarSyms,(pSVar12->super_Sym).m_id);
      pVVar4 = initialValue;
      pVVar10 = GlobOptBlockData::FindValue((GlobOptBlockData *)initialValue,&local_70->super_Sym);
      pSVar12 = local_78;
      if ((local_78 != (StackSym *)0x0) ||
         ((pVVar10 != (Value *)0x0 &&
          (pSVar12 = GlobOptBlockData::GetCopyPropSym
                               ((GlobOptBlockData *)pVVar4,&local_70->super_Sym,pVVar10),
          pSVar12 != (StackSym *)0x0)))) {
        pPVar11 = PropertySym::FindOrCreate
                            ((pSVar12->super_Sym).m_id,local_40->m_propertyId,
                             local_40->m_propertyIdIndex,local_40->m_inlineCacheIndex,
                             (local_40->super_Sym).field_0x15,this->globOpt->func);
        pVVar10 = GlobOptBlockData::FindValue((GlobOptBlockData *)pVVar4,&pPVar11->super_Sym);
        if (pVVar10 == (Value *)0x0) {
          GlobOptBlockData::SetValue((GlobOptBlockData *)pVVar4,local_68,&pPVar11->super_Sym);
          this_01 = (pBVar17->globOptData).liveFields;
          BVSparse<Memory::JitArenaAllocator>::Set(this_01,(pPVar11->super_Sym).m_id);
          MakePropertySymLiveOnBackEdges((PRE *)this_01,pPVar11,pLVar19,local_60);
        }
      }
      local_32[0].field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
      propertySym = (PropertySym *)0x0;
      bVar5 = JsUtil::
              BaseDictionary<PropertySym*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::TryGetValue<PropertySym*>
                        ((BaseDictionary<PropertySym*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)&pLVar19->initialValueFieldMap,&local_90,(Value **)&propertySym);
      pIVar9 = local_50;
      pVVar4 = local_60;
      if (bVar5) {
        if (local_50->m_kind == InstrKindProfiled) {
          if (*(ValueNumber *)&(propertySym->super_Sym)._vptr_Sym == local_60->valueNumber) {
            bVar5 = ValueType::IsUninitialized(&local_60->valueInfo->super_ValueType);
            if (bVar5) {
              pPVar13 = IR::Instr::AsProfiledInstr(pIVar9);
              aVar21 = (anon_union_2_4_ea848c7b_for_ValueType_13)(pPVar13->u).field_3.fldInfoData.f1
              ;
            }
            else {
              aVar21 = (pVVar4->valueInfo->super_ValueType).field_0;
            }
          }
          else {
            aVar21.field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
          }
          local_32[0] = aVar21;
          if (local_50->m_kind != InstrKindProfiled) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar8 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
            if (!bVar5) goto LAB_00440fe3;
            *puVar8 = 0;
          }
          *(anon_union_2_4_ea848c7b_for_ValueType_13 *)(local_50 + 1) = aVar21;
        }
      }
      else {
        local_32[0] = (local_68->valueInfo->super_ValueType).field_0;
      }
      pLVar19 = local_48;
      pIVar9 = local_50;
      pSVar12 = local_58;
      BVSparse<Memory::JitArenaAllocator>::Set
                (local_48->symsUsedBeforeDefined,(local_58->super_Sym).m_id);
      bVar5 = ValueType::IsLikelyNumber((ValueType *)&local_32[0].field_0);
      if (bVar5) {
        BVSparse<Memory::JitArenaAllocator>::Set
                  (pLVar19->likelyNumberSymsUsedBeforeDefined,(pSVar12->super_Sym).m_id);
        if ((this->globOpt->field_0xf5 & 2) == 0) {
          bVar5 = ValueType::IsInt((ValueType *)&local_32[0].field_0);
        }
        else {
          bVar5 = ValueType::IsLikelyInt((ValueType *)&local_32[0].field_0);
        }
        if (bVar5 != false) {
          BVSparse<Memory::JitArenaAllocator>::Set
                    (pLVar19->likelyIntSymsUsedBeforeDefined,(pSVar12->super_Sym).m_id);
        }
      }
      pJVar15 = JITTimeWorkItem::GetJITFunctionBody(this->globOpt->func->m_workItem);
      uVar22 = JITTimeFunctionBody::GetSourceContextId(pJVar15);
      pFVar16 = JITTimeWorkItem::GetJITTimeInfo(this->globOpt->func->m_workItem);
      uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar16);
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,FieldPREPhase,uVar22,uVar7);
      if (bVar5) {
        pBVar17 = Loop::GetHeadBlock(pLVar19);
        Output::Print(L"** TRACE: Field PRE: field pre-loaded in landing pad of loop head #%-3d: ",
                      (ulong)pBVar17->number);
        IR::Instr::Dump(pIVar9);
        Output::Print(L"\n");
        Output::Flush();
      }
      return 1;
    }
  }
  return 0;
}

Assistant:

BOOL GlobOpt::PRE::PreloadPRECandidate(Loop *loop, GlobHashBucket* candidate)
{
    // Insert a load for each field PRE candidate.
    PropertySym *propertySym = candidate->value->AsPropertySym();
    if (!candidates->candidatesToProcess->TestAndClear(propertySym->m_id))
    {
        return false;
    }
    Value * propSymValueOnBackEdge = candidate->element;

    StackSym *objPtrSym = propertySym->m_stackSym;
    Sym * objPtrCopyPropSym = nullptr;

    if (!loop->landingPad->globOptData.IsLive(objPtrSym))
    {
        if (PHASE_OFF(Js::MakeObjSymLiveInLandingPadPhase, this->globOpt->func))
        {
            return false;
        }
        if (objPtrSym->IsSingleDef())
        {
            // We can still try to do PRE if the object sym is single def, even if its not live in the landing pad.
            // We'll have to add a def instruction for the object sym in the landing pad, and then we can continue
            // pre-loading the current PRE candidate.
            // Case in point:
            // $L1            
            //                value|symStore
            //      t1 = o.x    (v1|t3)
            //      t2 = t1.y   (v2|t4) <-- t1 is not live in the loop landing pad
            //      jmp $L1

            if (!InsertSymDefinitionInLandingPad(objPtrSym, loop, &objPtrCopyPropSym))
            {
#if DBG_DUMP
                TraceFailedPreloadInLandingPad(loop, propertySym, _u("Failed to insert load of object sym in landing pad"));
#endif
                return false;
            }
        }
        else
        {
#if DBG_DUMP
            TraceFailedPreloadInLandingPad(loop, propertySym, _u("Object sym not live in landing pad and not single-def"));
#endif
            return false;
        }
    }
    Assert(loop->landingPad->globOptData.IsLive(objPtrSym));

    BasicBlock *landingPad = loop->landingPad;
    Sym *symStore = propSymValueOnBackEdge->GetValueInfo()->GetSymStore();

    // The symStore can't be live into the loop
    // The symStore needs to still have the same value
    Assert(symStore && symStore->IsStackSym());

    if (loop->landingPad->globOptData.IsLive(symStore))
    {
        // May have already been hoisted:
        //  o.x = t1;
        //  o.y = t1;
        return false;
    }
    Value *landingPadValue = landingPad->globOptData.FindValue(propertySym);

    // Value should be added as initial value or already be there.
    Assert(landingPadValue);

    IR::Instr * ldInstrInLoop = this->globOpt->prePassInstrMap->Lookup(propertySym->m_id, nullptr);
    Assert(ldInstrInLoop);
    Assert(ldInstrInLoop->GetDst() == nullptr);

    // Create instr to put in landing pad for compensation
    Assert(IsPREInstrCandidateLoad(ldInstrInLoop->m_opcode));

    IR::Instr * ldInstr = InsertPropertySymPreloadInLandingPad(ldInstrInLoop, loop, propertySym);
    if (!ldInstr)
    {
        return false;
    }

    Assert(ldInstr->GetDst() == nullptr);
    ldInstr->SetDst(IR::RegOpnd::New(symStore->AsStackSym(), TyVar, this->globOpt->func));
    loop->fieldPRESymStores->Set(symStore->m_id);
    landingPad->globOptData.liveVarSyms->Set(symStore->m_id);

    Value * objPtrValue = landingPad->globOptData.FindValue(objPtrSym);

    objPtrCopyPropSym = objPtrCopyPropSym ? objPtrCopyPropSym : objPtrValue ? landingPad->globOptData.GetCopyPropSym(objPtrSym, objPtrValue) : nullptr;
    if (objPtrCopyPropSym)
    {
        // If we inserted T4 = T1.y, and T3 is the copy prop sym for T1 in the landing pad, we need T3.y 
        // to be live on back edges to have the merge produce a value for T3.y. Having a value for T1.y 
        // produced from the merge is not enough as the T1.y in the loop will get obj-ptr-copy-propped to 
        // T3.y

        // T3.y
        PropertySym *newPropSym = PropertySym::FindOrCreate(
            objPtrCopyPropSym->m_id, propertySym->m_propertyId, propertySym->GetPropertyIdIndex(), propertySym->GetInlineCacheIndex(), propertySym->m_fieldKind, this->globOpt->func);

        if (!landingPad->globOptData.FindValue(newPropSym))
        {
            landingPad->globOptData.SetValue(landingPadValue, newPropSym);
            landingPad->globOptData.liveFields->Set(newPropSym->m_id);
            MakePropertySymLiveOnBackEdges(newPropSym, loop, propSymValueOnBackEdge);
        }
    }

    ValueType valueType(ValueType::Uninitialized);
    Value *initialValue = nullptr;

    if (loop->initialValueFieldMap.TryGetValue(propertySym, &initialValue))
    {
        if (ldInstr->IsProfiledInstr())
        {
            if (initialValue->GetValueNumber() == propSymValueOnBackEdge->GetValueNumber())
            {
                if (propSymValueOnBackEdge->GetValueInfo()->IsUninitialized())
                {
                    valueType = ldInstr->AsProfiledInstr()->u.FldInfo().valueType;
                }
                else
                {
                    valueType = propSymValueOnBackEdge->GetValueInfo()->Type();
                }
            }
            else
            {
                valueType = ValueType::Uninitialized;
            }
            ldInstr->AsProfiledInstr()->u.FldInfo().valueType = valueType;
        }
    }
    else
    {
        valueType = landingPadValue->GetValueInfo()->Type();
    }

    loop->symsUsedBeforeDefined->Set(symStore->m_id);

    if (valueType.IsLikelyNumber())
    {
        loop->likelyNumberSymsUsedBeforeDefined->Set(symStore->m_id);
        if (globOpt->DoAggressiveIntTypeSpec() ? valueType.IsLikelyInt() : valueType.IsInt())
        {
            // Can only force int conversions in the landing pad based on likely-int values if aggressive int type
            // specialization is enabled
            loop->likelyIntSymsUsedBeforeDefined->Set(symStore->m_id);
        }
    }

#if DBG_DUMP
    if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::FieldPREPhase, this->globOpt->func->GetSourceContextId(), this->globOpt->func->GetLocalFunctionId()))
    {
        Output::Print(_u("** TRACE: Field PRE: field pre-loaded in landing pad of loop head #%-3d: "), loop->GetHeadBlock()->GetBlockNum());
        ldInstr->Dump();
        Output::Print(_u("\n"));
        Output::Flush();
    }
#endif

    return true;
}